

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer-helpers.h
# Opt level: O0

Orphan<capnp::Text> *
capnp::_::PointerHelpers<capnp::Text,_(capnp::Kind)1>::disown(PointerBuilder builder)

{
  Orphan<capnp::Text> *in_RDI;
  OrphanBuilder local_30;
  
  PointerBuilder::disown(&local_30,(PointerBuilder *)&stack0x00000008);
  Orphan<capnp::Text>::Orphan(in_RDI,&local_30);
  OrphanBuilder::~OrphanBuilder(&local_30);
  return in_RDI;
}

Assistant:

static inline Orphan<T> disown(PointerBuilder builder) {
    return Orphan<T>(builder.disown());
  }